

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O3

uint16_t ucnv_countAliases_63(char *alias,UErrorCode *pErrorCode)

{
  uint16_t uVar1;
  ushort uVar2;
  uint16_t *puVar3;
  uint16_t *puVar4;
  uint16_t *puVar5;
  UBool UVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  uint uVar11;
  uint32_t uVar12;
  bool bVar13;
  char local_78 [72];
  
  UVar6 = haveAliasData(pErrorCode);
  if (UVar6 != '\0') {
    if (alias == (char *)0x0) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else if (*alias != '\0') {
      uVar1 = (gMainTable.optionTable)->stringNormalizationType;
      if (uVar1 != 0) {
        sVar10 = strlen(alias);
        if (0x3b < sVar10) {
          *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
          return 0;
        }
        ucnv_io_stripASCIIForCompare_63(local_78,alias);
        alias = local_78;
      }
      puVar5 = gMainTable.normalizedStringTable;
      puVar4 = gMainTable.stringTable;
      puVar3 = gMainTable.aliasList;
      uVar11 = 0;
      uVar12 = gMainTable.untaggedConvArraySize;
      uVar9 = gMainTable.untaggedConvArraySize >> 1;
      do {
        if (uVar1 == 0) {
          iVar7 = ucnv_compareNames_63(alias,(char *)(puVar4 + puVar3[uVar9]));
        }
        else {
          iVar7 = strcmp(alias,(char *)(puVar5 + puVar3[uVar9]));
        }
        uVar8 = uVar9;
        if ((-1 < iVar7) && (uVar8 = uVar12, uVar11 = uVar9, iVar7 == 0)) {
          uVar2 = gMainTable.untaggedConvArray[uVar9];
          if ((short)uVar2 < 0) {
            *pErrorCode = U_AMBIGUOUS_ALIAS_WARNING;
          }
          uVar9 = uVar2 & 0xfff;
          if (gMainTable.converterListSize <= uVar9) {
            return 0;
          }
          if ((ulong)gMainTable.taggedAliasArray
                     [(gMainTable.tagListSize - 1) * gMainTable.converterListSize + uVar9] == 0) {
            return 0;
          }
          return gMainTable.taggedAliasLists
                 [gMainTable.taggedAliasArray
                  [(gMainTable.tagListSize - 1) * gMainTable.converterListSize + uVar9]];
        }
        uVar12 = uVar8;
        uVar8 = uVar12 + uVar11 >> 1;
        bVar13 = uVar9 != uVar8;
        uVar9 = uVar8;
      } while (bVar13);
    }
  }
  return 0;
}

Assistant:

U_CAPI uint16_t U_EXPORT2
ucnv_countAliases(const char *alias, UErrorCode *pErrorCode)
{
    return ucnv_io_countAliases(alias, pErrorCode);
}